

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_dense.cpp
# Opt level: O1

void __thiscall
test_matrix_dense_constructors_initialiser_lists_Test::TestBody
          (test_matrix_dense_constructors_initialiser_lists_Test *this)

{
  void *pvVar1;
  pointer *__ptr;
  char *pcVar2;
  long lVar3;
  AssertionResult gtest_ar;
  Matrix_Dense<double,_0UL,_0UL> dynamic_matrix;
  initializer_list<Disa::Vector_Dense<double,_0UL>_> local_d8;
  initializer_list<double> local_c8;
  undefined1 local_b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  undefined1 local_a8 [32];
  vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  local_88;
  double local_70;
  pointer local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  double local_58;
  initializer_list<double> local_50;
  initializer_list<double> local_40;
  double local_30 [2];
  
  local_c8._M_array = (iterator)&local_40;
  local_40._M_array = (iterator)0x3ff0000000000000;
  local_40._M_len = 0x4000000000000000;
  local_c8._M_len = 2;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense((Vector_Dense<double,_0UL> *)local_b8,&local_c8);
  local_50._M_array = local_30;
  local_30[0] = 3.0;
  local_30[1] = 4.0;
  local_50._M_len = 2;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense
            ((Vector_Dense<double,_0UL> *)(local_a8 + 8),&local_50);
  local_d8._M_array = (iterator)local_b8;
  local_d8._M_len = 2;
  Disa::Matrix_Dense<double,_0UL,_0UL>::Matrix_Dense
            ((Matrix_Dense<double,_0UL,_0UL> *)&local_88,&local_d8);
  lVar3 = 0x30;
  do {
    pvVar1 = *(void **)((long)&local_d8._M_len + lVar3);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)(local_b8 + lVar3 + -8) - (long)pvVar1);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != 0);
  local_c8._M_array = (iterator)0x4014000000000000;
  local_c8._M_len = 0x4018000000000000;
  local_d8._M_len = 2;
  local_d8._M_array = (iterator)&local_c8;
  Disa::Vector_Dense<double,_2UL>::Vector_Dense
            ((Vector_Dense<double,_2UL> *)local_b8,(initializer_list<double> *)&local_d8);
  local_50._M_array = (iterator)&DAT_401c000000000000;
  local_50._M_len = 0x4020000000000000;
  local_40._M_len = 2;
  local_40._M_array = (iterator)&local_50;
  Disa::Vector_Dense<double,_2UL>::Vector_Dense((Vector_Dense<double,_2UL> *)local_a8,&local_40);
  local_58 = (double)CONCAT71(local_b8._1_7_,local_b8[0]);
  local_60 = local_b0;
  local_68 = (pointer)local_a8._0_8_;
  local_70 = (double)local_a8._8_8_;
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_b8,"dynamic_matrix[0][0]","1.0",
             *((local_88.
                super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super_vector<double,_std::allocator<double>_>).
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start,1.0);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if (local_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x26,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if ((initializer_list<double> *)local_d8._M_array != (initializer_list<double> *)0x0) {
      (*(code *)(*(iterator *)&(local_d8._M_array)->super_vector<double,_std::allocator<double>_>)
                [1])();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_b8,"dynamic_matrix[0][1]","2.0",
             ((local_88.
               super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super_vector<double,_std::allocator<double>_>).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[1],2.0);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if (local_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x27,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if ((initializer_list<double> *)local_d8._M_array != (initializer_list<double> *)0x0) {
      (*(code *)(*(iterator *)&(local_d8._M_array)->super_vector<double,_std::allocator<double>_>)
                [1])();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_b8,"dynamic_matrix[1][0]","3.0",
             *local_88.
              super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start[1].
              super_vector<double,_std::allocator<double>_>.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start,3.0);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if (local_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x28,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if ((initializer_list<double> *)local_d8._M_array != (initializer_list<double> *)0x0) {
      (*(code *)(*(iterator *)&(local_d8._M_array)->super_vector<double,_std::allocator<double>_>)
                [1])();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_b8,"dynamic_matrix[1][1]","4.0",
             local_88.
             super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[1],4.0);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if (local_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x29,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if ((initializer_list<double> *)local_d8._M_array != (initializer_list<double> *)0x0) {
      (*(code *)(*(iterator *)&(local_d8._M_array)->super_vector<double,_std::allocator<double>_>)
                [1])();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_b8,"static_matrix[0][0]","5.0",local_58,5.0);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if (local_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x2a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if ((initializer_list<double> *)local_d8._M_array != (initializer_list<double> *)0x0) {
      (*(code *)(*(iterator *)&(local_d8._M_array)->super_vector<double,_std::allocator<double>_>)
                [1])();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_b8,"static_matrix[0][1]","6.0",(double)local_60,6.0);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if (local_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x2b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if ((initializer_list<double> *)local_d8._M_array != (initializer_list<double> *)0x0) {
      (*(code *)(*(iterator *)&(local_d8._M_array)->super_vector<double,_std::allocator<double>_>)
                [1])();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_b8,"static_matrix[1][0]","7.0",(double)local_68,7.0);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if (local_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x2c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if ((initializer_list<double> *)local_d8._M_array != (initializer_list<double> *)0x0) {
      (*(code *)(*(iterator *)&(local_d8._M_array)->super_vector<double,_std::allocator<double>_>)
                [1])();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_b8,"static_matrix[1][1]","8.0",local_70,8.0);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if (local_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_dense.cpp"
               ,0x2d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if ((initializer_list<double> *)local_d8._M_array != (initializer_list<double> *)0x0) {
      (*(code *)(*(iterator *)&(local_d8._M_array)->super_vector<double,_std::allocator<double>_>)
                [1])();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  std::vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>::
  ~vector(&local_88);
  return;
}

Assistant:

TEST(test_matrix_dense, constructors_initialiser_lists) {

  Matrix_Dense<Scalar, 0, 0> dynamic_matrix = {{1.0, 2.0}, {3.0, 4.0}};
  Matrix_Dense<Scalar, 2, 2> static_matrix = {{5.0, 6.0}, {7.0, 8.0}};

  EXPECT_DOUBLE_EQ(dynamic_matrix[0][0], 1.0);
  EXPECT_DOUBLE_EQ(dynamic_matrix[0][1], 2.0);
  EXPECT_DOUBLE_EQ(dynamic_matrix[1][0], 3.0);
  EXPECT_DOUBLE_EQ(dynamic_matrix[1][1], 4.0);
  EXPECT_DOUBLE_EQ(static_matrix[0][0], 5.0);
  EXPECT_DOUBLE_EQ(static_matrix[0][1], 6.0);
  EXPECT_DOUBLE_EQ(static_matrix[1][0], 7.0);
  EXPECT_DOUBLE_EQ(static_matrix[1][1], 8.0);
}